

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

bool __thiscall glslang::TType::sameSpirvType(TType *this,TType *right)

{
  TSpirvType *this_00;
  TSpirvType *rhs;
  bool bVar1;
  
  this_00 = this->spirvType;
  rhs = right->spirvType;
  if (rhs == (TSpirvType *)0x0 || this_00 == (TSpirvType *)0x0) {
    return this_00 == (TSpirvType *)0x0 && rhs == (TSpirvType *)0x0;
  }
  bVar1 = TSpirvInstruction::operator==(&this_00->spirvInst,&rhs->spirvInst);
  if (bVar1) {
    bVar1 = std::operator==(&(this_00->typeParams).
                             super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                            ,&(rhs->typeParams).
                              super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                           );
    return bVar1;
  }
  return false;
}

Assistant:

bool sameSpirvType(const TType& right) const
    {
        return ((spirvType == nullptr && right.spirvType == nullptr) ||
                (spirvType != nullptr && right.spirvType != nullptr && *spirvType == *right.spirvType));
    }